

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  uint uVar3;
  pointer pMVar4;
  IConfig *pIVar5;
  ScopedElement *pSVar6;
  long in_RSI;
  long in_RDI;
  const_iterator itEnd;
  const_iterator it;
  AssertionResult *assertionResult;
  AssertionResult *in_stack_fffffffffffff9d8;
  XmlWriter *in_stack_fffffffffffff9e0;
  AssertionResult *in_stack_fffffffffffff9e8;
  allocator *paVar7;
  XmlWriter *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffffa00;
  XmlWriter *in_stack_fffffffffffffa08;
  XmlWriter *in_stack_fffffffffffffa10;
  string *in_stack_fffffffffffffa30;
  string *in_stack_fffffffffffffa38;
  XmlWriter *in_stack_fffffffffffffa40;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [40];
  string local_4a8 [39];
  allocator local_481;
  string local_480 [32];
  unsigned_long *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  XmlWriter *in_stack_fffffffffffffbb0;
  allocator local_409;
  string local_408 [79];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [40];
  string local_368 [79];
  allocator local_319;
  string local_318 [79];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [40];
  string local_278 [39];
  allocator local_251;
  string local_250 [40];
  string local_228 [39];
  allocator local_201;
  string local_200 [87];
  allocator local_1a9;
  string local_1a8 [79];
  allocator local_159;
  string local_158 [32];
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [63];
  allocator local_59;
  string local_58 [40];
  MessageInfo *local_30;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_28;
  AssertionResult *local_20;
  
  local_20 = (AssertionResult *)(in_RSI + 8);
  OVar2 = AssertionResult::getResultType((AssertionResult *)(in_RSI + 8));
  if (OVar2 != Ok) {
    local_28._M_current =
         (MessageInfo *)
         std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                   ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                    in_stack_fffffffffffff9d8);
    local_30 = (MessageInfo *)
               std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                          in_stack_fffffffffffff9d8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_fffffffffffff9e0,
                              (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_fffffffffffff9d8), bVar1) {
      pMVar4 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(&local_28);
      if (pMVar4->type == Info) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,"Info",&local_59);
        XmlWriter::scopedElement(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator->(&local_28);
        XmlWriter::ScopedElement::writeText
                  ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
                   SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffff9e0);
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
      }
      else {
        pMVar4 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&local_28);
        if (pMVar4->type == Warning) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_98,"Warning",&local_99);
          XmlWriter::scopedElement(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
          __gnu_cxx::
          __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
          ::operator->(&local_28);
          XmlWriter::ScopedElement::writeText
                    ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
                     SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffff9e0);
          std::__cxx11::string::~string(local_98);
          std::allocator<char>::~allocator((allocator<char> *)&local_99);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&local_28);
    }
  }
  pIVar5 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x10));
  uVar3 = (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
  if ((uVar3 & 1) == 0) {
    OVar2 = AssertionResult::getResultType(local_20);
    bVar1 = isOk(OVar2);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x18a7e0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Expression",&local_c1);
    XmlWriter::startElement(in_stack_fffffffffffff9e0,(string *)in_stack_fffffffffffff9d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"success",&local_e9);
    AssertionResult::succeeded((AssertionResult *)0x18a891);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
               SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"type",&local_111);
    AssertionResult::getTestMacroName_abi_cxx11_(in_stack_fffffffffffff9d8);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"filename",&local_159);
    AssertionResult::getSourceInfo(in_stack_fffffffffffff9d8);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"line",&local_1a9);
    AssertionResult::getSourceInfo(in_stack_fffffffffffff9d8);
    XmlWriter::writeAttribute<unsigned_long>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18aa1e);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18aa45);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"Original",&local_201);
    XmlWriter::scopedElement(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    AssertionResult::getExpression_abi_cxx11_(in_stack_fffffffffffff9e8);
    XmlWriter::ScopedElement::writeText
              ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
               SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
    std::__cxx11::string::~string(local_228);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffff9e0);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"Expanded",&local_251);
    XmlWriter::scopedElement(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffff9d8);
    XmlWriter::ScopedElement::writeText
              ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
               SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
    std::__cxx11::string::~string(local_278);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffff9e0);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
  }
  OVar2 = AssertionResult::getResultType(local_20);
  if (OVar2 == Info) {
    pSVar6 = (ScopedElement *)(in_RDI + 0x1d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"Info",&local_481);
    XmlWriter::scopedElement(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffff9d8);
    XmlWriter::ScopedElement::writeText
              (pSVar6,(string *)in_stack_fffffffffffff9e8,
               SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
    std::__cxx11::string::~string(local_4a8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffff9e0);
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
  }
  else if (OVar2 != Warning) {
    if (OVar2 == ExplicitFailure) {
      pSVar6 = (ScopedElement *)(in_RDI + 0x1d8);
      paVar7 = &local_4d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d0,"Failure",paVar7);
      XmlWriter::scopedElement(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffff9d8);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)paVar7,
                 SUB81((ulong)pSVar6 >> 0x38,0));
      std::__cxx11::string::~string(local_4f8);
      XmlWriter::ScopedElement::~ScopedElement(pSVar6);
      std::__cxx11::string::~string(local_4d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    }
    else if (OVar2 == ThrewException) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"Exception",&local_2a1);
      XmlWriter::scopedElement(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,"filename",&local_2c9);
      AssertionResult::getSourceInfo(in_stack_fffffffffffff9d8);
      XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9e0);
      paVar7 = &local_319;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_318,"line",paVar7);
      AssertionResult::getSourceInfo(in_stack_fffffffffffff9d8);
      XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
                 (unsigned_long *)in_stack_fffffffffffff9e0);
      AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffff9d8);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
                 SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
      std::__cxx11::string::~string(local_368);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18b145);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18b16c);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    }
    else if (OVar2 == FatalErrorCondition) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"Fatal Error Condition",&local_391);
      XmlWriter::scopedElement(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b8,"filename",&local_3b9);
      AssertionResult::getSourceInfo(in_stack_fffffffffffff9d8);
      in_stack_fffffffffffffa10 =
           (XmlWriter *)
           XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                     ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff9e0);
      paVar7 = &local_409;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_408,"line",paVar7);
      AssertionResult::getSourceInfo(in_stack_fffffffffffff9d8);
      XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
                 (unsigned_long *)in_stack_fffffffffffff9e0);
      AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffff9d8);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffff9f0,(string *)in_stack_fffffffffffff9e8,
                 SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffba8);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18b47f);
      std::__cxx11::string::~string(local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18b4a6);
      std::__cxx11::string::~string(local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
    }
  }
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x18b905);
  if (bVar1) {
    XmlWriter::endElement(in_stack_fffffffffffffa10);
  }
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) CATCH_OVERRIDE {
            const AssertionResult& assertionResult = assertionStats.assertionResult;

            // Print any info messages in <Info> tags.
            if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
                for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                        it != itEnd;
                        ++it ) {
                    if( it->type == ResultWas::Info ) {
                        m_xml.scopedElement( "Info" )
                            .writeText( it->message );
                    } else if ( it->type == ResultWas::Warning ) {
                        m_xml.scopedElement( "Warning" )
                            .writeText( it->message );
                    }
                }
            }

            // Drop out if result was successful but we're not printing them.
            if( !m_config->includeSuccessfulResults() && isOk(assertionResult.getResultType()) )
                return true;

            // Print the expression if there is one.
            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
					.writeAttribute( "type", assertionResult.getTestMacroName() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
            }

            // And... Print a result applicable to each result type.
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::FatalErrorCondition:
                    m_xml.scopedElement( "Fatal Error Condition" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    // Warning will already have been written
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    break;
                default:
                    break;
            }

            if( assertionResult.hasExpression() )
                m_xml.endElement();

            return true;
        }